

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_limit.cpp
# Opt level: O2

bool __thiscall
ON_SubDQuadNeighborhood::Set(ON_SubDQuadNeighborhood *this,ON_SubDFace *center_quad_face)

{
  ON_SubDVertex *pOVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  uchar uVar6;
  uint uVar7;
  ON_SubDFace *pOVar8;
  ON_SubDVertex *pOVar9;
  ON_SubDVertex *pOVar10;
  ON_SubDFace *pOVar11;
  ON_SubDEdgePtr OVar12;
  ulong uVar13;
  ON_SubDVertex **ppOVar14;
  ON_SubDEdge *(*papOVar15) [2];
  ON_SubDSectorIterator *pOVar16;
  ON_SubDSectorIterator *pOVar17;
  uint qfei;
  long lVar18;
  ulong uVar19;
  ON_SubDEdge *pOVar20;
  ulong uVar21;
  byte bVar22;
  bool bIsDartVertex [4];
  ON_SubDVertex *local_1b8;
  bool bIsCreaseEdge [4];
  ON_SubDFace *corner_faces [4];
  ON_SubDFace *qf_nbr_face [4];
  ON_SubDVertex *qf_vertex [4];
  ON_SubDVertex *outer_vertex [12];
  ON_SubDSectorIterator sit1;
  ON_SubDSectorIterator sit0;
  
  bVar22 = 0;
  Clear(this,false);
  if (center_quad_face == (ON_SubDFace *)0x0) {
LAB_00619ec5:
    bVar5 = true;
  }
  else {
    if (center_quad_face->m_edge_count == 4) {
      for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
        uVar13 = center_quad_face->m_edge4[lVar18].m_ptr;
        pOVar20 = (ON_SubDEdge *)(uVar13 & 0xfffffffffffffff8);
        if (((pOVar20 == (ON_SubDEdge *)0x0) || (pOVar20->m_vertex[0] == (ON_SubDVertex *)0x0)) ||
           (pOVar20->m_vertex[1] == (ON_SubDVertex *)0x0)) goto LAB_00619959;
        bVar5 = ON_SubDEdge::IsCrease(pOVar20);
        bIsCreaseEdge[lVar18] = bVar5;
        this->m_center_edges[lVar18] = pOVar20;
        pOVar9 = pOVar20->m_vertex[(uint)uVar13 & 1];
        qf_vertex[lVar18] = pOVar9;
        bVar5 = ON_SubDVertex::IsDart(pOVar9);
        bIsDartVertex[lVar18] = bVar5;
      }
      lVar18 = 0x14;
      do {
        if (lVar18 == 0x18) {
          qf_nbr_face[2] = (ON_SubDFace *)0x0;
          qf_nbr_face[3] = (ON_SubDFace *)0x0;
          qf_nbr_face[0] = (ON_SubDFace *)0x0;
          qf_nbr_face[1] = (ON_SubDFace *)0x0;
          lVar18 = 0;
          while (lVar18 != 4) {
            if (((bIsCreaseEdge[lVar18] == true) && (bIsDartVertex[lVar18] == false)) &&
               (bIsDartVertex[(uint)(lVar18 + 1) & 3] == false)) {
              this->m_bBoundaryCrease[lVar18] = true;
              this->m_boundary_crease_count = this->m_boundary_crease_count + '\x01';
              lVar18 = lVar18 + 1;
            }
            else {
              pOVar8 = ON_SubDEdge::NeighborFace
                                 (this->m_center_edges[lVar18],center_quad_face,false);
              qf_nbr_face[lVar18] = pOVar8;
              lVar18 = lVar18 + 1;
            }
          }
          sit0.m_current_fei[0] = 0;
          sit0.m_current_fei[1] = 0;
          sit0.m_initial_face_dir = 0;
          sit0.m_current_face_dir = 0;
          sit0.m_current_eptr[1].m_ptr = 0;
          sit0.m_initial_fvi = 0;
          sit0.m_current_fvi = 0;
          sit0.m_current_face = (ON_SubDFace *)0x0;
          sit0.m_current_eptr[0].m_ptr = 0;
          sit0.m_current_ring_index = 0;
          sit0.m_center_vertex = (ON_SubDVertex *)0x0;
          sit0.m_initial_face = (ON_SubDFace *)0x0;
          sit1.m_current_fei[0] = 0;
          sit1.m_current_fei[1] = 0;
          sit1.m_initial_face_dir = 0;
          sit1.m_current_face_dir = 0;
          sit1.m_current_eptr[1].m_ptr = 0;
          sit1.m_initial_fvi = 0;
          sit1.m_current_fvi = 0;
          sit1.m_current_face = (ON_SubDFace *)0x0;
          sit1.m_current_eptr[0].m_ptr = 0;
          sit1.m_current_ring_index = 0;
          sit1.m_center_vertex = (ON_SubDVertex *)0x0;
          sit1.m_initial_face = (ON_SubDFace *)0x0;
          this->m_face_grid[1][1] = center_quad_face;
          this->m_face_grid[1][0] = qf_nbr_face[0];
          this->m_face_grid[2][1] = qf_nbr_face[1];
          this->m_face_grid[1][2] = qf_nbr_face[2];
          this->m_face_grid[0][1] = qf_nbr_face[3];
          this->m_vertex_grid[1][1] = qf_vertex[0];
          this->m_vertex_grid[2][1] = qf_vertex[1];
          this->m_vertex_grid[2][2] = qf_vertex[2];
          this->m_vertex_grid[1][2] = qf_vertex[3];
          corner_faces[2] = (ON_SubDFace *)0x0;
          corner_faces[3] = (ON_SubDFace *)0x0;
          corner_faces[0] = (ON_SubDFace *)0x0;
          corner_faces[1] = (ON_SubDFace *)0x0;
          ppOVar14 = outer_vertex + 1;
          outer_vertex[10] = (ON_SubDVertex *)0x0;
          outer_vertex[0xb] = (ON_SubDVertex *)0x0;
          outer_vertex[8] = (ON_SubDVertex *)0x0;
          outer_vertex[9] = (ON_SubDVertex *)0x0;
          outer_vertex[6] = (ON_SubDVertex *)0x0;
          outer_vertex[7] = (ON_SubDVertex *)0x0;
          outer_vertex[4] = (ON_SubDVertex *)0x0;
          outer_vertex[5] = (ON_SubDVertex *)0x0;
          outer_vertex[2] = (ON_SubDVertex *)0x0;
          outer_vertex[3] = (ON_SubDVertex *)0x0;
          outer_vertex[0] = (ON_SubDVertex *)0x0;
          outer_vertex[1] = (ON_SubDVertex *)0x0;
          papOVar15 = this->m_edge_grid;
          uVar13 = 0xffffffff;
          for (uVar19 = 0; uVar19 != 4; uVar19 = uVar19 + 1) {
            uVar7 = (uint)uVar19 - 1 & 3;
            pOVar8 = qf_nbr_face[uVar19];
            if ((pOVar8 != (ON_SubDFace *)0x0) || (qf_nbr_face[uVar7] != (ON_SubDFace *)0x0)) {
              pOVar9 = ON_SubDSectorIterator::Initialize(&sit0,center_quad_face,0,(uint)uVar19);
              if (pOVar9 == (ON_SubDVertex *)0x0) goto LAB_00619ddf;
              pOVar9 = qf_vertex[uVar19];
              pOVar10 = ON_SubDSectorIterator::CenterVertex(&sit0);
              if (pOVar9 != pOVar10) goto LAB_00619ddf;
              pOVar16 = &sit0;
              pOVar17 = &sit1;
              for (lVar18 = 0x44; lVar18 != 0; lVar18 = lVar18 + -1) {
                *(undefined1 *)&pOVar17->m_center_vertex = *(undefined1 *)&pOVar16->m_center_vertex;
                pOVar16 = (ON_SubDSectorIterator *)((long)pOVar16 + (ulong)bVar22 * -2 + 1);
                pOVar17 = (ON_SubDSectorIterator *)((long)pOVar17 + (ulong)bVar22 * -2 + 1);
              }
              if (pOVar9->m_edge_count == 4) {
                bVar5 = 2 < pOVar9->m_face_count;
              }
              else {
                bVar5 = false;
              }
              if (pOVar8 == (ON_SubDFace *)0x0) {
                pOVar20 = (ON_SubDEdge *)0x0;
                local_1b8 = (ON_SubDVertex *)0x0;
                goto LAB_00619c31;
              }
              pOVar11 = ON_SubDSectorIterator::PrevFace(&sit0,Boundary);
              if (pOVar8 != pOVar11) goto LAB_00619ddf;
              OVar12 = ON_SubDSectorIterator::CurrentEdgePtr(&sit0,0);
              pOVar20 = (ON_SubDEdge *)(OVar12.m_ptr & 0xfffffffffffffff8);
              if ((pOVar20 == (ON_SubDEdge *)0x0) ||
                 (local_1b8 = pOVar20->m_vertex[~(uint)OVar12.m_ptr & 1],
                 local_1b8 == (ON_SubDVertex *)0x0)) goto LAB_00619ddf;
              if (bVar5) {
                pOVar8 = ON_SubDSectorIterator::PrevFace(&sit0,bIsDartVertex[uVar19] ^ AnyCrease);
                corner_faces[uVar19] = pOVar8;
                if (pOVar8 == (ON_SubDFace *)0x0) goto LAB_00619c31;
                OVar12 = ON_SubDSectorIterator::CurrentEdgePtr(&sit0,0);
                uVar21 = OVar12.m_ptr & 0xfffffffffffffff8;
                if (uVar21 == 0) goto LAB_00619ddf;
                pOVar10 = *(ON_SubDVertex **)(uVar21 + 0x80 + (ulong)(~(uint)OVar12.m_ptr & 1) * 8);
                pOVar1 = pOVar10;
joined_r0x00619d1b:
                if (pOVar1 == (ON_SubDVertex *)0x0) {
LAB_00619ddf:
                  ON_SubDIncrementErrorCount();
                  return 3 < uVar19;
                }
              }
              else {
LAB_00619c31:
                pOVar8 = qf_nbr_face[uVar7];
                if (pOVar8 == (ON_SubDFace *)0x0) {
                  uVar21 = 0;
                  pOVar10 = (ON_SubDVertex *)0x0;
                }
                else {
                  pOVar11 = ON_SubDSectorIterator::NextFace(&sit1,Boundary);
                  if (pOVar8 != pOVar11) goto LAB_00619ddf;
                  OVar12 = ON_SubDSectorIterator::CurrentEdgePtr(&sit1,1);
                  uVar21 = OVar12.m_ptr & 0xfffffffffffffff8;
                  if ((uVar21 == 0) ||
                     (pOVar10 = *(ON_SubDVertex **)
                                 (uVar21 + 0x80 + (ulong)(~(uint)OVar12.m_ptr & 1) * 8),
                     pOVar10 == (ON_SubDVertex *)0x0)) goto LAB_00619ddf;
                  if ((bVar5) && (corner_faces[uVar19] == (ON_SubDFace *)0x0)) {
                    pOVar8 = ON_SubDSectorIterator::NextFace(&sit1,bIsDartVertex[uVar7] ^ AnyCrease)
                    ;
                    corner_faces[uVar19] = pOVar8;
                    if ((pOVar20 == (ON_SubDEdge *)0x0) && (pOVar8 != (ON_SubDFace *)0x0)) {
                      OVar12 = ON_SubDSectorIterator::CurrentEdgePtr(&sit1,1);
                      pOVar20 = (ON_SubDEdge *)(OVar12.m_ptr & 0xfffffffffffffff8);
                      if (pOVar20 == (ON_SubDEdge *)0x0) goto LAB_00619ddf;
                      local_1b8 = pOVar20->m_vertex[~(uint)OVar12.m_ptr & 1];
                      pOVar1 = local_1b8;
                      goto joined_r0x00619d1b;
                    }
                  }
                }
              }
              if (corner_faces[uVar19] != (ON_SubDFace *)0x0) {
                pOVar9 = ON_SubDFace::QuadOppositeVertex(corner_faces[uVar19],pOVar9);
                ppOVar14[-1] = pOVar9;
              }
              if (pOVar20 != (ON_SubDEdge *)0x0) {
                (*papOVar15)[0] = pOVar20;
                *ppOVar14 = local_1b8;
              }
              if (uVar21 != 0) {
                *(ulong *)((long)this->m_edge_grid[0] + (ulong)(uVar7 << 4) + 8) = uVar21;
                uVar21 = uVar13 & 0xffffffff;
                if (uVar19 == 0) {
                  uVar21 = 0xb;
                }
                outer_vertex[uVar21] = pOVar10;
              }
            }
            uVar13 = uVar13 + 3;
            papOVar15 = papOVar15 + 1;
            ppOVar14 = ppOVar14 + 3;
          }
          this->m_face_grid[0][0] = corner_faces[0];
          this->m_face_grid[2][0] = corner_faces[1];
          this->m_face_grid[2][2] = corner_faces[2];
          this->m_face_grid[0][2] = corner_faces[3];
          this->m_vertex_grid[0][0] = outer_vertex[0];
          this->m_vertex_grid[1][0] = outer_vertex[1];
          this->m_vertex_grid[2][0] = outer_vertex[2];
          this->m_vertex_grid[3][0] = outer_vertex[3];
          this->m_vertex_grid[3][1] = outer_vertex[4];
          this->m_vertex_grid[3][2] = outer_vertex[5];
          this->m_vertex_grid[3][3] = outer_vertex[6];
          this->m_vertex_grid[2][3] = outer_vertex[7];
          this->m_vertex_grid[1][3] = outer_vertex[8];
          this->m_vertex_grid[0][3] = outer_vertex[9];
          *(undefined4 *)(this->m_vertex_grid[0] + 1) = outer_vertex[0xb]._0_4_;
          *(undefined4 *)((long)this->m_vertex_grid[0] + 0xc) = outer_vertex[10]._4_4_;
          *(undefined4 *)(this->m_vertex_grid[0] + 2) = outer_vertex[10]._0_4_;
          *(undefined4 *)((long)this->m_vertex_grid[0] + 0x14) = outer_vertex[10]._4_4_;
          if (center_quad_face->m_level_zero_face_id == 0) {
            uVar6 = '\0';
          }
          else {
            uVar7 = ON_SubDComponentBase::SubdivisionLevel
                              (&center_quad_face->super_ON_SubDComponentBase);
            uVar6 = (uchar)uVar7;
          }
          this->m_initial_subdivision_level = uVar6;
          this->m_current_subdivision_level = uVar6;
          SetPatchStatus(this,0);
          goto LAB_00619ec5;
        }
        lVar3 = lVar18 + -3;
        iVar2 = (int)lVar18;
        lVar4 = lVar18 + 1;
        lVar18 = lVar18 + 1;
      } while (qf_vertex[iVar2 - 0x13U & 3] ==
               (ON_SubDVertex *)
               (*(ON_SubDVertex *(*) [4])(this->m_edge_grid + -2))[lVar4]->m_P
               [~*(uint *)((center_quad_face->super_ON_SubDComponentBase).m_saved_subd_point1 +
                          lVar3) & 1]);
    }
LAB_00619959:
    ON_SubDIncrementErrorCount();
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool ON_SubDQuadNeighborhood::Set(
  const ON_SubDFace* center_quad_face
  )
{
  ON_SubDQuadNeighborhood::Clear(this, false);

  if (nullptr == center_quad_face)
    return true;

  if (4 != center_quad_face->m_edge_count)
    return ON_SUBD_RETURN_ERROR(false);

  const ON_SubDVertex* qf_vertex[4];
  bool bIsDartVertex[4];
  bool bIsCreaseEdge[4];
  for (unsigned int qfei = 0; qfei < 4; qfei++)
  {
    const ON__UINT_PTR eptr = center_quad_face->m_edge4[qfei].m_ptr;
    const ON_SubDEdge* edge = ON_SUBD_EDGE_POINTER(eptr);
    if (nullptr == edge)
      return ON_SUBD_RETURN_ERROR(false);
    if (nullptr == edge->m_vertex[0])
      return ON_SUBD_RETURN_ERROR(false);
    if (nullptr == edge->m_vertex[1])
      return ON_SUBD_RETURN_ERROR(false);

    bIsCreaseEdge[qfei] = edge->IsCrease();

    m_center_edges[qfei] = edge;

    qf_vertex[qfei] = edge->m_vertex[ON_SUBD_EDGE_DIRECTION(eptr)];
    
    bIsDartVertex[qfei] = qf_vertex[qfei]->IsDart();
  }

  for (unsigned int qfei = 0; qfei < 4; qfei++)
  {
    ON__UINT_PTR ev1 = 1-ON_SUBD_EDGE_DIRECTION(center_quad_face->m_edge4[qfei].m_ptr);
    if ( qf_vertex[(qfei+1)%4] != m_center_edges[qfei]->m_vertex[ev1] )
      return ON_SUBD_RETURN_ERROR(false);
  }
  
  const ON_SubDFace* qf_nbr_face[4] = {};
  for (unsigned int qfei = 0; qfei < 4; qfei++)
  {
    if (bIsCreaseEdge[qfei] && false == bIsDartVertex[qfei] && false == bIsDartVertex[(qfei+1)%4])
    {
      m_bBoundaryCrease[qfei] = true;
      m_boundary_crease_count++;
      continue;
    }
    qf_nbr_face[qfei] = m_center_edges[qfei]->NeighborFace(center_quad_face, false);
  }

  ON_SubDSectorIterator sit0, sit1;

  m_face_grid[1][1] = center_quad_face;
  m_face_grid[1][0] = qf_nbr_face[0];
  m_face_grid[2][1] = qf_nbr_face[1];
  m_face_grid[1][2] = qf_nbr_face[2];
  m_face_grid[0][1] = qf_nbr_face[3];

  m_vertex_grid[1][1] = qf_vertex[0];
  m_vertex_grid[2][1] = qf_vertex[1];
  m_vertex_grid[2][2] = qf_vertex[2];
  m_vertex_grid[1][2] = qf_vertex[3];

  const ON_SubDFace* corner_faces[4] = {};
  const ON_SubDVertex* outer_vertex[12] = {};

  for (unsigned int qfei = 0; qfei < 4; qfei++)
  {
    const unsigned int qfei3 = (qfei+3)%4;

    if ( nullptr == qf_nbr_face[qfei] && nullptr == qf_nbr_face[qfei3])
      continue;

    if (nullptr == sit0.Initialize(center_quad_face, 0, qfei))
      return ON_SUBD_RETURN_ERROR(false);

    if (qf_vertex[qfei] != sit0.CenterVertex())
      return ON_SUBD_RETURN_ERROR(false);

    sit1 = sit0;

    const bool b4EdgedCorner = (4 == qf_vertex[qfei]->m_edge_count && qf_vertex[qfei]->m_face_count >= 3);
    const ON_SubDEdge* e[2] = {};
    const ON_SubDVertex* v[2] = {};
    ON__UINT_PTR eptr;

    for (;;)
    {
      if (nullptr != qf_nbr_face[qfei])
      {
        if (qf_nbr_face[qfei] != sit0.PrevFace(ON_SubDSectorIterator::StopAt::Boundary))
          return ON_SUBD_RETURN_ERROR(false);
        eptr = sit0.CurrentEdgePtr(0).m_ptr;
        e[0] = ON_SUBD_EDGE_POINTER(eptr);
        if (nullptr == e[0])
          return ON_SUBD_RETURN_ERROR(false);
        v[0] = e[0]->m_vertex[1 - ON_SUBD_EDGE_DIRECTION(eptr)];
        if (nullptr == v[0])
          return ON_SUBD_RETURN_ERROR(false);
        
        if (b4EdgedCorner)
        {
          ON_SubDSectorIterator::StopAt stop_at
            = bIsDartVertex[qfei]
            ? ON_SubDSectorIterator::StopAt::Boundary
            : ON_SubDSectorIterator::StopAt::AnyCrease
            ;
          corner_faces[qfei] = sit0.PrevFace(stop_at);
          if (nullptr != corner_faces[qfei])
          {
            eptr = sit0.CurrentEdgePtr(0).m_ptr;
            e[1] = ON_SUBD_EDGE_POINTER(eptr);
            if (nullptr == e[1])
              return ON_SUBD_RETURN_ERROR(false);
            v[1] = e[1]->m_vertex[1 - ON_SUBD_EDGE_DIRECTION(eptr)];
            if (nullptr == v[1])
              return ON_SUBD_RETURN_ERROR(false);
            break;
          }
        }
      }

      if (nullptr == e[1] && nullptr != qf_nbr_face[qfei3])
      {
        if (qf_nbr_face[qfei3] != sit1.NextFace(ON_SubDSectorIterator::StopAt::Boundary))
          return ON_SUBD_RETURN_ERROR(false);
        eptr = sit1.CurrentEdgePtr(1).m_ptr;
        e[1] = ON_SUBD_EDGE_POINTER(eptr);
        if (nullptr == e[1])
          return ON_SUBD_RETURN_ERROR(false);
        v[1] = e[1]->m_vertex[1 - ON_SUBD_EDGE_DIRECTION(eptr)];
        if (nullptr == v[1])
          return ON_SUBD_RETURN_ERROR(false);
        if (b4EdgedCorner && nullptr == corner_faces[qfei])
        {
          ON_SubDSectorIterator::StopAt stop_at
            = bIsDartVertex[qfei3]
            ? ON_SubDSectorIterator::StopAt::Boundary
            : ON_SubDSectorIterator::StopAt::AnyCrease
            ;
          corner_faces[qfei] = sit1.NextFace(stop_at);
          if (nullptr != corner_faces[qfei] && nullptr == e[0] )
          {
            eptr = sit1.CurrentEdgePtr(1).m_ptr;
            e[0] = ON_SUBD_EDGE_POINTER(eptr);
            if (nullptr == e[0])
              return ON_SUBD_RETURN_ERROR(false);
            v[0] = e[0]->m_vertex[1 - ON_SUBD_EDGE_DIRECTION(eptr)];
            if (nullptr == v[0])
              return ON_SUBD_RETURN_ERROR(false);
            break;
          }
        }
      }
      break;
    }

    if ( nullptr != corner_faces[qfei] )
      outer_vertex[3 * qfei] = corner_faces[qfei]->QuadOppositeVertex(qf_vertex[qfei]);

    if (nullptr != e[0])
    {
      m_edge_grid[qfei][0] = e[0];
      outer_vertex[3 * qfei + 1] = v[0];
    }

    if (nullptr != e[1])
    {
      m_edge_grid[qfei3][1] = e[1];
      outer_vertex[(3 * qfei + 11) % 12] = v[1];
    }   
  }

  m_face_grid[0][0] = corner_faces[0]; // lower left corner
  m_face_grid[2][0] = corner_faces[1]; // lower right corner
  m_face_grid[2][2] = corner_faces[2]; // upper right corner
  m_face_grid[0][2] = corner_faces[3]; // upper left corner

  m_vertex_grid[0][0] = outer_vertex[0]; // lower left corner
  m_vertex_grid[1][0] = outer_vertex[1];
  m_vertex_grid[2][0] = outer_vertex[2];
  
  m_vertex_grid[3][0] = outer_vertex[3]; // lower right corner
  m_vertex_grid[3][1] = outer_vertex[4];
  m_vertex_grid[3][2] = outer_vertex[5];

  m_vertex_grid[3][3] = outer_vertex[6]; // upper right corner
  m_vertex_grid[2][3] = outer_vertex[7];
  m_vertex_grid[1][3] = outer_vertex[8];
  
  m_vertex_grid[0][3] = outer_vertex[9]; // upper left corner
  m_vertex_grid[0][2] = outer_vertex[10];
  m_vertex_grid[0][1] = outer_vertex[11];

  m_initial_subdivision_level = (unsigned char)(center_quad_face->m_level_zero_face_id > 0 ? center_quad_face->SubdivisionLevel() : 0U);
  m_current_subdivision_level = m_initial_subdivision_level;
  
  SetPatchStatus(0);
  
#if defined(ON_DEBUG)
  IsValid(); // will trigger a break if "this" is not valid
#endif
  
  return true;
}